

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

string * __thiscall
spirv_cross::CompilerGLSL::to_extract_constant_composite_expression_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,uint32_t result_type,SPIRConstant *c,
          uint32_t *chain,uint32_t length)

{
  bool bVar1;
  uint32_t id;
  SPIRType *type;
  bool local_1e9;
  SPIRType *composite_type;
  TypedID<(spirv_cross::Types)1> local_1a4;
  undefined1 local_1a0 [8];
  SPIRConstant tmp;
  uint32_t length_local;
  uint32_t *chain_local;
  SPIRConstant *c_local;
  uint32_t result_type_local;
  CompilerGLSL *this_local;
  
  tmp.specialization_constant_macro_name.field_2._12_4_ = length;
  SPIRConstant::SPIRConstant((SPIRConstant *)local_1a0);
  TypedID<(spirv_cross::Types)1>::TypedID(&local_1a4,result_type);
  tmp.super_IVariant._vptr_IVariant._4_4_ = local_1a4.id;
  id = TypedID::operator_cast_to_unsigned_int((TypedID *)&(c->super_IVariant).field_0xc);
  type = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,id);
  local_1e9 = false;
  if (type->basetype != Struct) {
    local_1e9 = VectorView<unsigned_int>::empty(&(type->array).super_VectorView<unsigned_int>);
  }
  if (local_1e9 != false) {
    if (((c->specialization ^ 0xffU) & 1) == 0) {
      __assert_fail("!c.specialization",
                    "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_glsl.cpp"
                    ,0x1493,
                    "string spirv_cross::CompilerGLSL::to_extract_constant_composite_expression(uint32_t, const SPIRConstant &, const uint32_t *, uint32_t)"
                   );
    }
    bVar1 = Compiler::is_matrix(&this->super_Compiler,type);
    if (bVar1) {
      if (tmp.specialization_constant_macro_name.field_2._12_4_ == 2) {
        tmp.m.c[0].id[2].id = 1;
        tmp.m.id[2].id = 1;
        tmp.super_IVariant._8_8_ = (c->m).c[*chain].r[chain[1]];
      }
      else {
        if (tmp.specialization_constant_macro_name.field_2._12_4_ != 1) {
          __assert_fail("length == 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_glsl.cpp"
                        ,0x149f,
                        "string spirv_cross::CompilerGLSL::to_extract_constant_composite_expression(uint32_t, const SPIRConstant &, const uint32_t *, uint32_t)"
                       );
        }
        tmp.m.c[0].id[2].id = type->vecsize;
        tmp.m.id[2].id = 1;
        memcpy(&tmp.super_IVariant.self,(c->m).c + *chain,0x34);
      }
    }
    else {
      if (tmp.specialization_constant_macro_name.field_2._12_4_ != 1) {
        __assert_fail("length == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_glsl.cpp"
                      ,0x14a7,
                      "string spirv_cross::CompilerGLSL::to_extract_constant_composite_expression(uint32_t, const SPIRConstant &, const uint32_t *, uint32_t)"
                     );
      }
      tmp.m.c[0].id[2].id = 1;
      tmp.m.id[2].id = 1;
      tmp.super_IVariant._8_8_ = (c->m).c[0].r[*chain];
    }
    constant_expression_abi_cxx11_
              (__return_storage_ptr__,this,(SPIRConstant *)local_1a0,false,false);
    SPIRConstant::~SPIRConstant((SPIRConstant *)local_1a0);
    return __return_storage_ptr__;
  }
  __assert_fail("composite_type.basetype != SPIRType::Struct && composite_type.array.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_glsl.cpp"
                ,0x1492,
                "string spirv_cross::CompilerGLSL::to_extract_constant_composite_expression(uint32_t, const SPIRConstant &, const uint32_t *, uint32_t)"
               );
}

Assistant:

string CompilerGLSL::to_extract_constant_composite_expression(uint32_t result_type, const SPIRConstant &c,
                                                              const uint32_t *chain, uint32_t length)
{
	// It is kinda silly if application actually enter this path since they know the constant up front.
	// It is useful here to extract the plain constant directly.
	SPIRConstant tmp;
	tmp.constant_type = result_type;
	auto &composite_type = get<SPIRType>(c.constant_type);
	assert(composite_type.basetype != SPIRType::Struct && composite_type.array.empty());
	assert(!c.specialization);

	if (is_matrix(composite_type))
	{
		if (length == 2)
		{
			tmp.m.c[0].vecsize = 1;
			tmp.m.columns = 1;
			tmp.m.c[0].r[0] = c.m.c[chain[0]].r[chain[1]];
		}
		else
		{
			assert(length == 1);
			tmp.m.c[0].vecsize = composite_type.vecsize;
			tmp.m.columns = 1;
			tmp.m.c[0] = c.m.c[chain[0]];
		}
	}
	else
	{
		assert(length == 1);
		tmp.m.c[0].vecsize = 1;
		tmp.m.columns = 1;
		tmp.m.c[0].r[0] = c.m.c[0].r[chain[0]];
	}

	return constant_expression(tmp);
}